

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::unregister_handler
          (Reactor<iqnet::Null_lock> *this,Event_handler *eh)

{
  bool bVar1;
  uint uVar2;
  iterator local_68;
  const_iterator local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  _Self local_48 [3];
  int local_2c;
  _Self local_28;
  h_iterator i;
  scoped_lock lk;
  Event_handler *eh_local;
  Reactor<iqnet::Null_lock> *this_local;
  
  Null_lock::scoped_lock::scoped_lock
            ((scoped_lock *)((long)&i._M_node + 7),(Null_lock *)&this->field_0x8);
  local_2c = (*eh->_vptr_Event_handler[9])();
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::find(&this->handlers,&local_2c);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::end(&this->handlers);
  bVar1 = std::operator!=(&local_28,local_48);
  if (bVar1) {
    local_50 = local_28._M_node;
    local_58 = (_Base_ptr)
               std::
               map<int,iqnet::Event_handler*,std::less<int>,std::allocator<std::pair<int_const,iqnet::Event_handler*>>>
               ::erase_abi_cxx11_((map<int,iqnet::Event_handler*,std::less<int>,std::allocator<std::pair<int_const,iqnet::Event_handler*>>>
                                   *)&this->handlers,local_28._M_node);
    local_68._M_node = (_List_node_base *)find_handler_state(this,eh);
    std::_List_const_iterator<iqnet::Reactor_base::HandlerState>::_List_const_iterator
              (&local_60,&local_68);
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    erase(&this->handlers_states,local_60);
    uVar2 = (*eh->_vptr_Event_handler[2])();
    if ((uVar2 & 1) != 0) {
      this->num_stoppers = this->num_stoppers - 1;
    }
  }
  Null_lock::scoped_lock::~scoped_lock((scoped_lock *)((long)&i._M_node + 7));
  return;
}

Assistant:

void Reactor<Lock>::unregister_handler( Event_handler* eh )
{
  scoped_lock lk(lock);
  h_iterator i = handlers.find(eh->get_handler());

  if( i != handlers.end() )
  {
    handlers.erase(i);
    handlers_states.erase(find_handler_state(eh));

    if (eh->is_stopper())
      num_stoppers--;
  }
}